

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Span<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node>::erase
          (Span<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node> *this,size_t bucket)

{
  byte bVar1;
  Entry *pEVar2;
  long *plVar3;
  
  bVar1 = this->offsets[bucket];
  this->offsets[bucket] = 0xff;
  pEVar2 = this->entries;
  plVar3 = *(long **)(pEVar2[bVar1].storage.data + 0x18);
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 8))();
  }
  QPixmapCache::Key::~Key((Key *)(pEVar2[bVar1].storage.data + 0x10));
  this->entries[bVar1].storage.data[0] = this->nextFree;
  this->nextFree = bVar1;
  return;
}

Assistant:

void erase(size_t bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket < SpanConstants::NEntries);
        Q_ASSERT(offsets[bucket] != SpanConstants::UnusedEntry);

        unsigned char entry = offsets[bucket];
        offsets[bucket] = SpanConstants::UnusedEntry;

        entries[entry].node().~Node();
        entries[entry].nextFree() = nextFree;
        nextFree = entry;
    }